

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O1

string * __thiscall
pbrt::BSSRDFTable::ToString_abi_cxx11_(string *__return_storage_ptr__,BSSRDFTable *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>const&>
            (__return_storage_ptr__,
             "[ BSSRDFTable rhoSamples: %s radiusSamples: %s profile: %s rhoEff: %s profileCDF: %s ]"
             ,&this->rhoSamples,&this->radiusSamples,&this->profile,&this->rhoEff,&this->profileCDF)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string BSSRDFTable::ToString() const {
    return StringPrintf("[ BSSRDFTable rhoSamples: %s radiusSamples: %s profile: %s "
                        "rhoEff: %s profileCDF: %s ]",
                        rhoSamples, radiusSamples, profile, rhoEff, profileCDF);
}